

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O2

void __thiscall
CBucket::insert(CBucket *this,AbstractSearchState *AbstractSearchState1,int priority)

{
  int iVar1;
  int startbucketindex;
  int local_34;
  AbstractSearchState *local_30;
  
  if (priority == 1000000000) {
    startbucketindex = this->numofbuckets + -1;
  }
  else {
    iVar1 = priority - this->firstpriority;
    startbucketindex = this->numofbuckets + -2;
    if (iVar1 < startbucketindex) {
      startbucketindex = iVar1;
    }
  }
  local_34 = priority;
  local_30 = AbstractSearchState1;
  std::vector<AbstractSearchState_*,_std::allocator<AbstractSearchState_*>_>::push_back
            (this->bucketV + startbucketindex,&local_30);
  local_30->heapindex =
       (int)((ulong)((long)this->bucketV[startbucketindex].
                           super__Vector_base<AbstractSearchState_*,_std::allocator<AbstractSearchState_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)this->bucketV[startbucketindex].
                          super__Vector_base<AbstractSearchState_*,_std::allocator<AbstractSearchState_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
  if (startbucketindex == this->numofbuckets + -2) {
    std::vector<int,_std::allocator<int>_>::push_back(&this->assortedpriorityV,&local_34);
    iVar1 = (int)((ulong)((long)(this->assortedpriorityV).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(this->assortedpriorityV).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2);
    if (this->maxassortedpriorityVsize < iVar1) {
      this->maxassortedpriorityVsize = iVar1;
    }
  }
  if (local_34 < this->currentminelement_priority || this->currentminelement_priority == 1000000000)
  {
    recomputeminelementupfrombucket(this,startbucketindex);
  }
  return;
}

Assistant:

void insert(AbstractSearchState *AbstractSearchState1, int priority)
    {
        //compute bucket index
        int bucketindex = priority - firstpriority;
        if (priority == INFINITECOST) {
            bucketindex = numofbuckets - 1;
        }
        else if (bucketindex >= numofbuckets - 2) {
            bucketindex = numofbuckets - 2; //overflow bucket
        }

        //insert the element itself
        bucketV[bucketindex].push_back(AbstractSearchState1);
        AbstractSearchState1->heapindex = (int)bucketV[bucketindex].size() - 1;

        if (bucketindex == numofbuckets - 2) {
            assortedpriorityV.push_back(priority);

            if (maxassortedpriorityVsize < (int)assortedpriorityV.size()) maxassortedpriorityVsize
                = (int)assortedpriorityV.size();
        }

        //re-compute minelement if necessary
        if (priority < currentminelement_priority || currentminelement_priority == INFINITECOST) {
            recomputeminelementupfrombucket(bucketindex);
        }
    }